

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::ConsoleReporter::printHeaderString(ConsoleReporter *this,string *_string,size_t indent)

{
  ostream *os;
  ulong uVar1;
  long lVar2;
  char local_69;
  Column local_68;
  
  uVar1 = std::__cxx11::string::find((char *)_string,0x180448,0);
  lVar2 = uVar1 + 2;
  if (0x13 < uVar1) {
    lVar2 = 0;
  }
  os = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  TextFlow::Column::Column(&local_68,_string);
  local_68.m_indent = lVar2 + indent;
  local_68.m_initialIndent = indent;
  TextFlow::operator<<(os,&local_68);
  local_69 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_69,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.m_string.m_string._M_dataplus._M_p != &local_68.m_string.m_string.field_2) {
    operator_delete(local_68.m_string.m_string._M_dataplus._M_p,
                    local_68.m_string.m_string.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ConsoleReporter::printHeaderString(std::string const& _string, std::size_t indent) {
    // We want to get a bit fancy with line breaking here, so that subsequent
    // lines start after ":" if one is present, e.g.
    // ```
    // blablabla: Fancy
    //            linebreaking
    // ```
    // but we also want to avoid problems with overly long indentation causing
    // the text to take up too many lines, e.g.
    // ```
    // blablabla: F
    //            a
    //            n
    //            c
    //            y
    //            .
    //            .
    //            .
    // ```
    // So we limit the prefix indentation check to first quarter of the possible
    // width
    std::size_t idx = _string.find( ": " );
    if ( idx != std::string::npos && idx < CATCH_CONFIG_CONSOLE_WIDTH / 4 ) {
        idx += 2;
    } else {
        idx = 0;
    }
    m_stream << TextFlow::Column( _string )
                  .indent( indent + idx )
                  .initialIndent( indent )
           << '\n';
}